

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

double __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::LogFunc::precision
          (LogFunc *this,EvalContext *ctx,double ret,double x)

{
  Precision PVar1;
  double dVar2;
  
  if (x <= 0.0) {
    return NAN;
  }
  PVar1 = ctx->floatPrecision;
  if (PVar1 != PRECISION_LOWP) {
    if (PVar1 != PRECISION_MEDIUMP) {
      if (PVar1 != PRECISION_HIGHP) {
        return 0.0;
      }
      if ((0.5 <= x) && (x <= 2.0)) {
        dVar2 = ldexp(1.0,-0x15);
        return dVar2;
      }
      dVar2 = 3.0;
      goto LAB_007aa284;
    }
    if ((0.5 <= x) && (x <= 2.0)) {
      dVar2 = ldexp(1.0,-7);
      return dVar2;
    }
  }
  dVar2 = 2.0;
LAB_007aa284:
  dVar2 = tcu::FloatFormat::ulp(&ctx->format,ret,dVar2);
  return dVar2;
}

Assistant:

double		precision	(const EvalContext& ctx, double ret, double x) const
	{
		if (x <= 0)
			return TCU_NAN;

		switch (ctx.floatPrecision)
		{
			case glu::PRECISION_HIGHP:
				return (0.5 <= x && x <= 2.0) ? deLdExp(1.0, -21) : ctx.format.ulp(ret, 3.0);
			case glu::PRECISION_MEDIUMP:
				return (0.5 <= x && x <= 2.0) ? deLdExp(1.0, -7) : ctx.format.ulp(ret, 2.0);
			case glu::PRECISION_LOWP:
				return ctx.format.ulp(ret, 2.0);
			default:
				DE_FATAL("Impossible");
		}

		return 0;
	}